

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O1

void __thiscall
FastPForLib::VariableByte::_encodeArray<unsigned_long>
          (VariableByte *this,unsigned_long *in,size_t length,uint32_t *out,size_t *nvalue)

{
  void *__s;
  ulong uVar1;
  long lVar2;
  size_t bytenvalue;
  size_t local_28;
  
  local_28 = *nvalue << 2;
  encodeToByteArray<unsigned_long>(this,in,length,(uint8_t *)out,&local_28);
  __s = (void *)((long)out + local_28);
  if (((ulong)__s & 3) != 0) {
    lVar2 = local_28 + (long)out;
    uVar1 = (ulong)((uint)lVar2 & 3);
    memset(__s,0,4 - uVar1);
    __s = (void *)((uVar1 ^ 3) + 1 + lVar2);
  }
  *nvalue = (ulong)((long)__s - (long)out) >> 2;
  return;
}

Assistant:

void _encodeArray(const T *in, const size_t length, uint32_t *out,
                    size_t &nvalue) {
    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    size_t bytenvalue = nvalue * sizeof(uint32_t);
    encodeToByteArray(in, length, bout, bytenvalue);
    bout += bytenvalue;
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0;
    }
    const size_t storageinbytes = bout - initbout;
    assert((storageinbytes % 4) == 0);
    nvalue = storageinbytes / 4;
  }